

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

bool ExecuteCommand(CRPCCommand *command,JSONRPCRequest *request,UniValue *result,bool last_handler)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  type_error *e;
  exception *e_1;
  RPCCommandExecution execution;
  JSONRPCRequest *in_stack_fffffffffffffdb8;
  UniValue *in_stack_fffffffffffffdc0;
  JSONRPCRequest *in_stack_fffffffffffffdc8;
  function<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool)> *in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffddf;
  string *in_stack_fffffffffffffde0;
  RPCCommandExecution *in_stack_fffffffffffffde8;
  undefined1 local_1ab;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *in_stack_ffffffffffffffb0;
  JSONRPCRequest *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  RPCCommandExecution::RPCCommandExecution(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  bVar2 = UniValue::isObject((UniValue *)in_stack_fffffffffffffdb8);
  if (bVar2) {
    transformNamedArguments(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    local_1ab = std::function<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool)>::operator()
                          (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                           in_stack_fffffffffffffdc0,(bool)in_stack_fffffffffffffddf);
    JSONRPCRequest::~JSONRPCRequest(in_stack_fffffffffffffdb8);
  }
  else {
    local_1ab = std::function<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool)>::operator()
                          (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                           in_stack_fffffffffffffdc0,(bool)in_stack_fffffffffffffddf);
  }
  RPCCommandExecution::~RPCCommandExecution((RPCCommandExecution *)in_stack_fffffffffffffdc0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_1ab;
  }
  __stack_chk_fail();
}

Assistant:

static bool ExecuteCommand(const CRPCCommand& command, const JSONRPCRequest& request, UniValue& result, bool last_handler)
{
    try {
        RPCCommandExecution execution(request.strMethod);
        // Execute, convert arguments to array if necessary
        if (request.params.isObject()) {
            return command.actor(transformNamedArguments(request, command.argNames), result, last_handler);
        } else {
            return command.actor(request, result, last_handler);
        }
    } catch (const UniValue::type_error& e) {
        throw JSONRPCError(RPC_TYPE_ERROR, e.what());
    } catch (const std::exception& e) {
        throw JSONRPCError(RPC_MISC_ERROR, e.what());
    }
}